

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

BSDFSample * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
          (BSDFSample *__return_storage_ptr__,
          LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,Float uc
          ,Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int i;
  uint uVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 unaff_R12;
  uint64_t oldstate;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 extraout_var [60];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [60];
  undefined1 auVar38 [64];
  undefined1 in_XMM7 [16];
  Vector3f wo_00;
  Vector3f VVar39;
  Vector3f wo_01;
  Vector3f wo_02;
  SampledSpectrum f;
  Float pdf;
  BSDFSample bs;
  float local_11c;
  float local_118 [4];
  undefined4 local_108;
  TransportMode local_104;
  Tuple2<pbrt::Point2,_float> local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  BSDFSample local_a8;
  BSDFSample local_78;
  ConductorBxDF *local_50;
  undefined1 local_48 [16];
  undefined1 auVar36 [64];
  
  fVar24 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar38._8_56_ = wo._8_56_;
  auVar38._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_d8 = auVar38._0_16_;
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x3a3,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  bVar20 = (this->config).twoSided != '\0';
  bVar4 = fVar24 < -fVar24;
  if (bVar4 && bVar20) {
    local_d8._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    local_d8._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    local_d8._12_4_ = wo._12_4_ ^ 0x80000000;
  }
  local_48._4_12_ = wo._12_12_;
  local_48._0_4_ = (uint)(bVar4 && bVar20) * (int)-fVar24 + (uint)(!bVar4 || !bVar20) * (int)fVar24;
  local_f8._0_4_ = uc;
  VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_d8._0_8_;
  if ((float)local_48._0_4_ <= 0.0) {
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    ConductorBxDF::Sample_f(&local_a8,&this->bottom,wo_00,uc,u,mode,All);
  }
  else {
    VVar39.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
    DielectricInterfaceBxDF::Sample_f(&local_a8,&this->top,VVar39,uc,u,mode,All);
  }
  local_11c = local_a8.pdf;
  if (0.0 < local_a8.pdf) {
    if ((local_a8.flags & Reflection) != Unset) {
      if (bVar4 && bVar20) {
        auVar21._0_8_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar21._8_4_ = 0x80000000;
        auVar21._12_4_ = 0x80000000;
        local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z =
             -local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_a8.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar21);
      }
      __return_storage_ptr__->flags = local_a8.flags;
      *(ulong *)(__return_storage_ptr__->f).values.values =
           CONCAT44(local_a8.f.values.values[1],local_a8.f.values.values[0]);
      *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
           CONCAT44(local_a8.f.values.values[3],local_a8.f.values.values[2]);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x =
           local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      *(ulong *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
           CONCAT44(local_a8.pdf,local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z);
      return __return_storage_ptr__;
    }
    local_b8._8_8_ = 0;
    local_b8._0_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    local_b8._4_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    local_e8._4_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_e8._0_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_e8._8_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_e8._12_4_ = local_a8.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar21 = vandps_avx512vl(local_e8,auVar22);
    local_118[0] = auVar21._0_4_ * local_a8.f.values.values[0];
    local_118[1] = auVar21._4_4_ * local_a8.f.values.values[1];
    local_118[2] = auVar21._8_4_ * local_a8.f.values.values[2];
    local_118[3] = auVar21._12_4_ * local_a8.f.values.values[3];
    if ((this->config).maxDepth != '\0') {
      uVar18 = ((ulong)(local_d8._0_8_ * -0x395b586ca42e166b) >> 0x2f ^
               local_d8._0_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      uVar18 = (CONCAT44((int)(uVar18 >> 0x20),local_48._0_4_) ^
               (uVar18 ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      uVar18 = (uVar18 >> 0x2f ^ uVar18) * -0x395b586ca42e166b;
      uVar18 = (*(uint *)(Options + 4) & 0xffffff ^ uVar18 ^ 0x1a929e4d6f47a654 ^
               (uVar18 >> 0x2f | (ulong)(*(uint *)(Options + 4) & 0xff000000))) *
               -0x395b586ca42e166b;
      uVar18 = (uVar18 >> 0x2f ^ uVar18) * -0x395b586ca42e166b;
      lVar1 = (uVar18 >> 0x2f ^ uVar18) * 2 + 1;
      local_c0 = this->g;
      uVar18 = (long)u->super_Tuple2<pbrt::Point2,_float> * -0x395b586ca42e166b;
      uVar18 = ((uVar18 >> 0x2f ^ uVar18) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
               -0x395b586ca42e166b;
      uVar18 = (uVar18 >> 0x2f ^ uVar18) * -0x395b586ca42e166b;
      uVar18 = (local_f8._0_4_ & 0xffffff ^ uVar18 ^ 0x1a929e4d6f47a654 ^
               ((ulong)(local_f8._0_4_ & 0xff000000) | uVar18 >> 0x2f)) * -0x395b586ca42e166b;
      uVar18 = (uVar18 >> 0x2f ^ uVar18) * -0x395b586ca42e166b;
      uVar18 = (uVar18 >> 0x2f ^ uVar18) * 0x5851f42d4c957f2d + lVar1 * 0x5851f42d4c957f2e;
      auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar32 = vcmpss_avx512f(ZEXT816(0) << 0x40,local_48,1);
      local_f8 = ZEXT416((uint)((byte)uVar32 & 1) * (int)this->thickness);
      local_50 = &this->bottom;
      uVar17 = 0;
      local_108 = (int)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar4 && bVar20);
      local_104 = mode;
      do {
        fVar24 = 1.0;
        lVar14 = 1;
        auVar31 = ZEXT464((uint)local_118[0]);
        do {
          auVar21 = vmaxss_avx(ZEXT416((uint)local_118[lVar14]),auVar31._0_16_);
          auVar31 = ZEXT1664(auVar21);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        if ((uVar17 < 4) || (fVar23 = auVar21._0_4_ / local_11c, 0.25 <= fVar23)) {
LAB_003450c7:
          if (((float)local_e8._0_4_ != 0.0) || (NAN((float)local_e8._0_4_))) {
            fVar23 = (this->albedo).values.values[0];
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
LAB_00345124:
              uVar12 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
              bVar15 = (byte)(uVar18 >> 0x3b);
              auVar21 = vcvtusi2ss_avx512f(in_XMM7,uVar12 >> bVar15 | uVar12 << 0x20 - bVar15);
              auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),
                                   SUB6416(ZEXT464(0x3f7fffff),0));
              auVar31._0_4_ = logf(1.0 - auVar21._0_4_);
              auVar31._4_60_ = extraout_var;
              local_d8 = auVar31._0_16_;
              if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                   Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                   ::reg == '\0') &&
                 (iVar13 = __cxa_guard_acquire(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                ::
                                                Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                                ::reg), iVar13 != 0)) {
                StatRegisterer::StatRegisterer
                          ((StatRegisterer *)
                           &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                            Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                            ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                           (PixelAccumFunc)0x0);
                __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                     ::
                                     Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg);
              }
              uVar18 = uVar18 * 0x5851f42d4c957f2d + lVar1;
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar21 = vandps_avx512vl(local_e8,auVar28);
              fVar24 = -(float)local_d8._0_4_ / (1.0 / auVar21._0_4_);
              auVar3._12_4_ = 0;
              auVar3._0_12_ = ZEXT812(0);
              uVar32 = vcmpss_avx512f(auVar3 << 0x20,local_e8,1);
              bVar4 = (bool)((byte)uVar32 & 1);
              auVar38 = ZEXT864(0) << 0x20;
              fVar24 = (float)local_f8._0_4_ +
                       (float)((uint)bVar4 * (int)fVar24 + (uint)!bVar4 * (int)-fVar24);
              *(long *)(in_FS_OFFSET + -0x5a8) = *(long *)(in_FS_OFFSET + -0x5a8) + 1;
              if ((fVar24 != (float)local_f8._0_4_) || (NAN(fVar24) || NAN((float)local_f8._0_4_)))
              {
                if ((fVar24 <= 0.0) || (this->thickness <= fVar24)) {
                  auVar21 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar24));
                  uVar32 = vcmpss_avx512f(ZEXT416((uint)fVar24),ZEXT816(0) << 0x20,1);
                  local_f8._4_12_ = auVar21._4_12_;
                  local_f8._0_4_ = (uint)!(bool)((byte)uVar32 & 1) * auVar21._0_4_;
                  bVar4 = false;
                  bVar20 = true;
                }
                else {
                  local_d8._0_4_ = fVar24;
                  auVar25._0_8_ = local_b8._0_8_ ^ 0x8000000080000000;
                  auVar25._8_4_ = local_b8._8_4_ ^ 0x80000000;
                  auVar25._12_4_ = local_b8._12_4_ ^ 0x80000000;
                  local_78.f.values.values[2] = -(float)local_e8._0_4_;
                  local_78.f.values.values._0_8_ = vmovlps_avx(auVar25);
                  uVar19 = uVar18 * 0x5851f42d4c957f2d + lVar1;
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = uVar18;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = uVar19;
                  auVar22 = vpunpcklqdq_avx(auVar26,auVar33);
                  auVar21 = vpsrlvq_avx2(auVar22,_DAT_005c85b0);
                  auVar28 = vpsrlvq_avx2(auVar22,_DAT_005c85c0);
                  auVar21 = vpshufd_avx(auVar21 ^ auVar28,0xe8);
                  auVar37 = ZEXT1260(auVar21._4_12_);
                  auVar22 = vpsrlq_avx(auVar22,0x3b);
                  auVar22 = vpshufd_avx(auVar22,0xe8);
                  auVar21 = vprorvd_avx512vl(auVar21,auVar22);
                  auVar21 = vcvtudq2ps_avx512vl(auVar21);
                  auVar8._8_4_ = 0x2f800000;
                  auVar8._0_8_ = 0x2f8000002f800000;
                  auVar8._12_4_ = 0x2f800000;
                  auVar21 = vmulps_avx512vl(auVar21,auVar8);
                  auVar9._8_4_ = 0x3f7fffff;
                  auVar9._0_8_ = 0x3f7fffff3f7fffff;
                  auVar9._12_4_ = 0x3f7fffff;
                  auVar21 = vminps_avx512vl(auVar21,auVar9);
                  local_100 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar21);
                  uVar32 = 0;
                  VVar39 = SampleHenyeyGreenstein
                                     ((Vector3f *)&local_78,local_c0,(Point2f *)&local_100,&local_bc
                                     );
                  auVar36._0_4_ = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar36._4_60_ = auVar37;
                  if ((local_bc <= 0.0) || ((auVar36._0_4_ == 0.0 && (!NAN(auVar36._0_4_))))) {
                    (__return_storage_ptr__->f).values.values[0] = 0.0;
                    (__return_storage_ptr__->f).values.values[1] = 0.0;
                    (__return_storage_ptr__->f).values.values[2] = 0.0;
                    (__return_storage_ptr__->f).values.values[3] = 0.0;
                    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
                    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                    *(undefined8 *)
                     &(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
                    __return_storage_ptr__->flags = Unset;
                    bVar4 = true;
                  }
                  else {
                    local_118[0] = local_bc * (this->albedo).values.values[0] * local_118[0];
                    local_118[1] = local_bc * (this->albedo).values.values[1] * local_118[1];
                    local_118[2] = local_bc * (this->albedo).values.values[2] * local_118[2];
                    local_118[3] = local_bc * (this->albedo).values.values[3] * local_118[3];
                    local_11c = local_11c * local_bc;
                    bVar4 = false;
                    local_b8._8_8_ = uVar32;
                    local_b8._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    local_e8 = auVar36._0_16_;
                    local_f8 = ZEXT416((uint)local_d8._0_4_);
                  }
                  bVar20 = false;
                  auVar38 = ZEXT1264(ZEXT812(0));
                  uVar18 = uVar19 * 0x5851f42d4c957f2d + lVar1;
                }
              }
              else {
                *(long *)(in_FS_OFFSET + -0x5b0) = *(long *)(in_FS_OFFSET + -0x5b0) + 1;
                auVar30 = ZEXT832(0) << 0x20;
                __return_storage_ptr__->f = (SampledSpectrum)auVar30._0_16_;
                __return_storage_ptr__->wi = (Vector3f)auVar30._16_12_;
                __return_storage_ptr__->pdf = (Float)auVar30._28_4_;
                __return_storage_ptr__->flags = Unset;
                bVar4 = true;
                bVar20 = false;
              }
              if (!bVar20) goto LAB_0034567f;
            }
            else {
              uVar19 = 0;
              while (uVar16 = uVar19, uVar16 != 3) {
                fVar23 = (this->albedo).values.values[uVar16 + 1];
                if ((fVar23 != 0.0) || (uVar19 = uVar16 + 1, NAN(fVar23))) break;
              }
              if (uVar16 < 3) goto LAB_00345124;
              FVar2 = this->thickness;
              auVar10._8_4_ = 0x7fffffff;
              auVar10._0_8_ = 0x7fffffff7fffffff;
              auVar10._12_4_ = 0x7fffffff;
              auVar22 = vandps_avx512vl(ZEXT416((uint)FVar2),auVar10);
              auVar21 = ZEXT416((uint)FVar2);
              if (1.1754944e-38 < auVar22._0_4_) {
                auVar11._8_4_ = 0x80000000;
                auVar11._0_8_ = 0x8000000080000000;
                auVar11._12_4_ = 0x80000000;
                auVar22 = vxorps_avx512vl(auVar22,auVar11);
                auVar34._8_4_ = 0x7fffffff;
                auVar34._0_8_ = 0x7fffffff7fffffff;
                auVar34._12_4_ = 0x7fffffff;
                auVar21 = vandps_avx(auVar34,local_e8);
                local_d8 = ZEXT416((uint)FVar2);
                fVar24 = expf(auVar22._0_4_ / auVar21._0_4_);
                auVar21 = local_d8;
              }
              uVar32 = vcmpss_avx512f(auVar21,ZEXT416((uint)local_f8._0_4_),0);
              local_f8._4_12_ = auVar21._4_12_;
              local_f8._0_4_ = (uint)!(bool)((byte)uVar32 & 1) * auVar21._0_4_;
              local_118[0] = fVar24 * local_118[0];
              local_118[1] = fVar24 * local_118[1];
              local_118[2] = fVar24 * local_118[2];
              local_118[3] = fVar24 * local_118[3];
            }
            uVar12 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
            bVar15 = (byte)(uVar18 >> 0x3b);
            uVar18 = uVar18 * 0x5851f42d4c957f2d + lVar1;
            uVar19 = uVar18 * 0x5851f42d4c957f2d + lVar1;
            auVar21 = vcvtusi2ss_avx512f(in_XMM7,uVar12 >> bVar15 | uVar12 << 0x20 - bVar15);
            auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),
                                 SUB6416(ZEXT464(0x3f7fffff),0));
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar18;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar19;
            auVar28 = vpunpcklqdq_avx(auVar27,auVar35);
            auVar22 = vpsrlvq_avx2(auVar28,_DAT_005c85b0);
            auVar3 = vpsrlvq_avx2(auVar28,_DAT_005c85c0);
            auVar22 = vpshufd_avx(auVar22 ^ auVar3,0xe8);
            auVar28 = vpsrlq_avx(auVar28,0x3b);
            auVar28 = vpshufd_avx(auVar28,0xe8);
            auVar22 = vprorvd_avx512vl(auVar22,auVar28);
            auVar22 = vcvtudq2ps_avx512vl(auVar22);
            auVar5._8_4_ = 0x2f800000;
            auVar5._0_8_ = 0x2f8000002f800000;
            auVar5._12_4_ = 0x2f800000;
            auVar22 = vmulps_avx512vl(auVar22,auVar5);
            auVar6._8_4_ = 0x3f7fffff;
            auVar6._0_8_ = 0x3f7fffff3f7fffff;
            auVar6._12_4_ = 0x3f7fffff;
            auVar22 = vminps_avx512vl(auVar22,auVar6);
            local_100 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar22);
            wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_b8._0_8_ ^ 0x8000000080000000;
            wo_01.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_e8._0_4_;
            if (((float)local_f8._0_4_ != 0.0) || (NAN((float)local_f8._0_4_))) {
              wo_02.super_Tuple3<pbrt::Vector3,_float>.z =
                   wo_01.super_Tuple3<pbrt::Vector3,_float>.z;
              wo_02.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)(int)wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              wo_02.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)(wo_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
              DielectricInterfaceBxDF::Sample_f
                        (&local_78,&this->top,wo_02,auVar21._0_4_,(Point2f *)&local_100,local_104,
                         All);
            }
            else {
              ConductorBxDF::Sample_f
                        (&local_78,local_50,wo_01,auVar21._0_4_,(Point2f *)&local_100,local_104,All)
              ;
            }
            if ((local_78.pdf <= 0.0) ||
               ((local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                (!NAN(local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) {
              (__return_storage_ptr__->f).values.values[0] = 0.0;
              (__return_storage_ptr__->f).values.values[1] = 0.0;
              (__return_storage_ptr__->f).values.values[2] = 0.0;
              (__return_storage_ptr__->f).values.values[3] = 0.0;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
              __return_storage_ptr__->flags = Unset;
              bVar4 = true;
            }
            else {
              local_118[0] = local_78.f.values.values[0] * local_118[0];
              local_118[1] = local_78.f.values.values[1] * local_118[1];
              local_118[2] = local_78.f.values.values[2] * local_118[2];
              local_118[3] = local_78.f.values.values[3] * local_118[3];
              local_11c = local_11c * local_78.pdf;
              local_b8._8_8_ = 0;
              local_b8._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.x;
              local_b8._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.y;
              local_e8 = ZEXT416((uint)local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z);
              if (((undefined1)local_78.flags & Transmission) == Unset) {
                auVar29._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar29._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar29._8_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar29._12_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar7._8_4_ = 0x7fffffff;
                auVar7._0_8_ = 0x7fffffff7fffffff;
                auVar7._12_4_ = 0x7fffffff;
                auVar21 = vandps_avx512vl(auVar29,auVar7);
                local_118[0] = auVar21._0_4_ * local_118[0];
                local_118[1] = auVar21._4_4_ * local_118[1];
                local_118[2] = auVar21._8_4_ * local_118[2];
                local_118[3] = auVar21._12_4_ * local_118[3];
                bVar4 = false;
              }
              else {
                bVar15 = (byte)local_108;
                if (bVar15 != 0) {
                  local_b8._0_8_ =
                       local_78.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  local_b8._8_4_ = 0x80000000;
                  local_b8._12_4_ = 0x80000000;
                }
                fVar24 = (float)((uint)(bVar15 & 1) *
                                 (int)-local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z +
                                (uint)!(bool)(bVar15 & 1) *
                                (int)local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                local_e8 = ZEXT416((uint)fVar24);
                *(ulong *)(__return_storage_ptr__->f).values.values =
                     CONCAT44(local_118[1],local_118[0]);
                *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
                     CONCAT44(local_118[3],local_118[2]);
                uVar32 = vmovlps_avx(local_b8);
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x =
                     (float)(int)uVar32;
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
                     (float)(int)((ulong)uVar32 >> 0x20);
                (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar24;
                __return_storage_ptr__->pdf = local_11c;
                __return_storage_ptr__->flags =
                     ((float)local_48._0_4_ * local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z <=
                     0.0) + GlossyReflection;
                bVar4 = true;
              }
            }
            auVar38 = ZEXT864(0) << 0x20;
            uVar18 = uVar19 * 0x5851f42d4c957f2d + lVar1;
          }
          else {
            auVar30 = ZEXT832(0) << 0x20;
            __return_storage_ptr__->f = (SampledSpectrum)auVar30._0_16_;
            __return_storage_ptr__->wi = (Vector3f)auVar30._16_12_;
            __return_storage_ptr__->pdf = (Float)auVar30._28_4_;
            __return_storage_ptr__->flags = Unset;
            bVar4 = true;
          }
        }
        else {
          auVar21 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar23)),auVar38._0_16_);
          uVar12 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
          bVar15 = (byte)(uVar18 >> 0x3b);
          auVar22 = vcvtusi2ss_avx512f(in_XMM7,uVar12 >> bVar15 | uVar12 << 0x20 - bVar15);
          auVar22 = vminss_avx(ZEXT416((uint)(auVar22._0_4_ * 2.3283064e-10)),
                               SUB6416(ZEXT464(0x3f7fffff),0));
          fVar23 = auVar21._0_4_;
          if (auVar22._0_4_ < fVar23) {
            auVar30 = ZEXT1632(ZEXT816(0) << 0x40);
            __return_storage_ptr__->f = (SampledSpectrum)auVar30._0_16_;
            __return_storage_ptr__->wi = (Vector3f)auVar30._16_12_;
            __return_storage_ptr__->pdf = (Float)auVar30._28_4_;
            __return_storage_ptr__->flags = Unset;
          }
          else {
            local_11c = local_11c * (1.0 - fVar23);
            auVar38 = ZEXT1264(ZEXT812(0));
          }
          uVar18 = uVar18 * 0x5851f42d4c957f2d + lVar1;
          bVar4 = true;
          if (fVar23 <= auVar22._0_4_) goto LAB_003450c7;
        }
LAB_0034567f:
        if (bVar4) {
          return __return_storage_ptr__;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (this->config).maxDepth);
    }
  }
  (__return_storage_ptr__->f).values.values[0] = 0.0;
  (__return_storage_ptr__->f).values.values[1] = 0.0;
  (__return_storage_ptr__->f).values.values[2] = 0.0;
  (__return_storage_ptr__->f).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  __return_storage_ptr__->flags = Unset;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ for layered BSDF sampling
        bool flipWi = false;
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            flipWi = true;
        }

        // Sample BSDF at entrance interface to get initial direction _w_
        bool enteredTop = wo.z > 0;
        BSDFSample bs =
            enteredTop ? top.Sample_f(wo, uc, u, mode) : bottom.Sample_f(wo, uc, u, mode);
        if (!bs)
            return {};
        if (bs.IsReflection()) {
            if (flipWi)
                bs.wi = -bs.wi;
            return bs;
        }
        Vector3f w = bs.wi;

        // Declare _RNG_ for layered BSDF sampling
        RNG rng(Hash(GetOptions().seed, wo), Hash(uc, u));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Declare common variables for layered BSDF sampling
        SampledSpectrum f = bs.f * AbsCosTheta(bs.wi);
        Float pdf = bs.pdf;
        Float z = enteredTop ? thickness : 0;
        HGPhaseFunction phase(g);

        for (int depth = 0; depth < config.maxDepth; ++depth) {
            // Follow random walk through layeres to sample layered BSDF
            // Possibly terminate layered BSDF sampling with Russian Roulette
            Float rrBeta = f.MaxComponentValue() / pdf;
            if (depth > 3 && rrBeta < 0.25) {
                Float q = std::max<Float>(0, 1 - rrBeta);
                if (r() < q)
                    return {};
                pdf *= 1 - q;
            }
            if (w.z == 0)
                return {};

            if (albedo) {
                // Sample potential scattering event in layered medium
                Float sigma_t = 1;
                Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                Float zp = w.z > 0 ? (z + dz) : (z - dz);
                CHECK_RARE(1e-5, zp == z);
                if (zp == z)
                    return {};
                if (0 < zp && zp < thickness) {
                    // Update path state for valid scattering event between interfaces
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//f *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
f *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
f /= AbsCosTheta(w);
#endif
                    PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                    if (!ps || ps.wi.z == 0)
                        return {};
                    f *= albedo * ps.p;
                    pdf *= ps.pdf;
                    w = ps.wi;
                    z = zp;

                    continue;
                }
                z = Clamp(zp, 0, thickness);
                if (z == 0)
                    DCHECK_LT(w.z, 0);
                else
                    DCHECK_GT(w.z, 0);

            } else {
                // Advance to the other layer interface
                // Bounce back and forth between the top and bottom
                z = (z == thickness) ? 0 : thickness;
                f *= Tr(thickness, w);
            }
            // Initialize _interface_ for current interface surface
            TopOrBottomBxDF<TopBxDF, BottomBxDF> interface;
            if (z == 0)
                interface = &bottom;
            else
                interface = &top;

            // Sample interface BSDF to determine new path direction
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample bs = interface.Sample_f(-w, uc, u, mode);
            if (!bs || bs.wi.z == 0)
                return {};
            f *= bs.f;
            pdf *= bs.pdf;
            w = bs.wi;

            // Return _BSDFSample_ if path has left the layers
            if (bs.IsTransmission()) {
                BxDFFlags flags = SameHemisphere(wo, w) ? BxDFFlags::GlossyReflection
                                                        : BxDFFlags::GlossyTransmission;
                if (flipWi)
                    w = -w;
                return BSDFSample(f, w, pdf, flags);
            }

            // Scale _f_ by cosine term after scattering at the interface
            f *= AbsCosTheta(bs.wi);
        }
        return {};
    }